

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

Vec_Wec_t * Str_ManDeriveTrees(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  Gia_Obj_t *pGVar3;
  Vec_Str_t *vStr;
  char *pcVar4;
  Abc_Nam_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Int_t *pVVar5;
  uint uVar6;
  Gia_Obj_t *pObj;
  long lVar7;
  undefined8 uStack_38;
  int fFound;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                  ,0x172,"Vec_Wec_t *Str_ManDeriveTrees(Gia_Man_t *)");
  }
  uStack_38 = in_RAX;
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  for (lVar7 = 0; lVar7 < p->nObjs; lVar7 = lVar7 + 1) {
    if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[lVar7] != 0)) {
      pGVar3 = Gia_ManObj(p,(int)lVar7);
      pObj = pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff);
      iVar1 = Gia_ObjIsMux(p,pObj);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjRefNum(p,pObj);
        if (iVar1 == 1) {
          pObj->field_0x3 = pObj->field_0x3 | 0x40;
        }
      }
      pGVar3 = pGVar3 + -(ulong)(*(uint *)&pGVar3->field_0x4 & 0x1fffffff);
      iVar1 = Gia_ObjIsMux(p,pGVar3);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjRefNum(p,pGVar3);
        if (iVar1 == 1) {
          pGVar3->field_0x3 = pGVar3->field_0x3 | 0x40;
        }
      }
    }
  }
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar4 = (char *)malloc(1000);
  vStr->pArray = pcVar4;
  p_00 = Abc_NamStart(10000,0x32);
  p_01 = (Vec_Wec_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  pVVar5 = (Vec_Int_t *)calloc(1000,0x10);
  p_01->pArray = pVVar5;
  Vec_WecPushLevel(p_01);
  lVar7 = 0;
  do {
    if (p->nObjs <= lVar7) {
      Abc_NamStop(p_00);
      free(vStr->pArray);
      free(vStr);
      return p_01;
    }
    if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[lVar7] != 0)) {
      pGVar3 = Gia_ManObj(p,(int)lVar7);
      uVar6 = (uint)*(undefined8 *)pGVar3;
      if (((uVar6 >> 0x1e & 1) == 0) &&
         (((pGVar3[-(ulong)(uVar6 & 0x1fffffff)].field_0x3 & 0x40) != 0 ||
          ((pGVar3[-(ulong)((uint)((ulong)*(undefined8 *)pGVar3 >> 0x20) & 0x1fffffff)].field_0x3 &
           0x40) != 0)))) {
        Str_MuxStructDump(p,pGVar3,vStr);
        iVar1 = Abc_NamStrFindOrAdd(p_00,vStr->pArray,&fFound);
        if (fFound == 0) {
          Vec_WecPushLevel(p_01);
        }
        iVar2 = Abc_NamObjNumMax(p_00);
        if (iVar2 != p_01->nSize) {
          __assert_fail("Abc_NamObjNumMax(pNames) == Vec_WecSize(vGroups)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                        ,0x192,"Vec_Wec_t *Str_ManDeriveTrees(Gia_Man_t *)");
        }
        pVVar5 = Vec_WecEntry(p_01,iVar1);
        Vec_IntPush(pVVar5,(int)lVar7);
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Str_ManDeriveTrees( Gia_Man_t * p )
{
    int fPrintStructs = 0;
    Abc_Nam_t * pNames; 
    Vec_Wec_t * vGroups;  
    Vec_Str_t * vStr;
    Gia_Obj_t * pObj, * pFanin;
    int i, iStructId, fFound;
    assert( p->pMuxes != NULL );
    // mark MUXes whose only fanout is a MUX
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    Gia_ManForEachMuxId( p, i )
    {
        pObj = Gia_ManObj(p, i);
        pFanin = Gia_ObjFanin0(pObj);
        if ( Gia_ObjIsMux(p, pFanin) && Gia_ObjRefNum(p, pFanin) == 1 )
            pFanin->fMark0 = 1;
        pFanin = Gia_ObjFanin1(pObj);
        if ( Gia_ObjIsMux(p, pFanin) && Gia_ObjRefNum(p, pFanin) == 1 )
            pFanin->fMark0 = 1;
    }
    // traverse for top level MUXes
    vStr   = Vec_StrAlloc( 1000 );
    pNames = Abc_NamStart( 10000, 50 );
    vGroups = Vec_WecAlloc( 1000 );
    Vec_WecPushLevel( vGroups );
    Gia_ManForEachMuxId( p, i )
    {
        // skip internal
        pObj = Gia_ManObj(p, i);
        if ( pObj->fMark0 )
            continue;
        // skip trees of size one
        if ( !Gia_ObjFanin0(pObj)->fMark0 && !Gia_ObjFanin1(pObj)->fMark0 )
            continue;
        // hash the tree
        Str_MuxStructDump( p, pObj, vStr );
        iStructId = Abc_NamStrFindOrAdd( pNames, Vec_StrArray(vStr), &fFound );
        if ( !fFound ) Vec_WecPushLevel( vGroups );
        assert( Abc_NamObjNumMax(pNames) == Vec_WecSize(vGroups) );
        Vec_IntPush( Vec_WecEntry(vGroups, iStructId), i );
    }
    if ( fPrintStructs )
    {
        char * pTemp; 
        Abc_NamManForEachObj( pNames, pTemp, i )
        {
            printf( "%5d : ", i );
            printf( "Occur = %4d   ", Vec_IntSize(Vec_WecEntry(vGroups,i)) );
            printf( "Size = %4d   ",  Str_ManMuxCountOne(pTemp) );
            printf( "%s\n", pTemp );
        }
    }
    Abc_NamStop( pNames );
    Vec_StrFree( vStr );
    return vGroups;
}